

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

Aig_Man_t *
createDisjunctiveMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors,int *startMonotonePropPo)

{
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Ptr_t *p_01;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *p_03;
  Aig_Obj_t *local_198;
  Aig_Obj_t *local_180;
  Aig_Obj_t *local_168;
  Aig_Obj_t *local_158;
  Vec_Int_t *vConsequentCandidatesLocal;
  Vec_Int_t *vAntecedentsLocal;
  int pendingSignalIndexLocal;
  Vec_Ptr_t *vCandMonotoneFlopInput;
  Vec_Ptr_t *vCandMonotoneProp;
  Aig_Obj_t *pObjMonotonePropDriver;
  Aig_Obj_t *pObjPrevCandMonotone;
  Aig_Obj_t *pObjCandMonotone;
  Aig_Obj_t *pObjConsecDriverNew;
  Aig_Obj_t *pObjConsecDriver;
  Aig_Obj_t *pObjAnteDisjunction;
  Vec_Ptr_t *vConseCandFlopOutput;
  Aig_Obj_t *pObjSafetyInvariantPoDriver;
  Aig_Obj_t *pObjConseCandFlop;
  Aig_Obj_t *pPendingFlop;
  Aig_Obj_t *pObjPendingAndNextPending;
  Aig_Obj_t *pObjPendingDriverNew;
  Aig_Obj_t *pObjDriverNew;
  Aig_Obj_t *pObjDriver;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObj;
  int poCreated;
  int poCopied;
  int loCreated;
  int loCopied;
  int liCreated;
  int liCopied;
  int piCopied;
  int nRegCount;
  int i;
  int iElem;
  Aig_Man_t *pNewAig;
  int *startMonotonePropPo_local;
  antecedentConsequentVectorsStruct *anteConseVectors_local;
  aigPoIndices *aigPoIndicesArg_local;
  Aig_Man_t *pAig_local;
  
  loCopied = 0;
  poCopied = 0;
  iVar2 = aigPoIndicesArg->attrPendingSignalIndex;
  p = anteConseVectors->attrAntecedents;
  p_00 = anteConseVectors->attrConsequentCandidates;
  if (p_00 == (Vec_Int_t *)0x0) {
    pAig_local = (Aig_Man_t *)0x0;
  }
  else {
    iVar1 = Aig_ManObjNumMax(pAig);
    pAig_local = Aig_ManStart(iVar1);
    sVar3 = strlen(pAig->pName);
    pcVar4 = (char *)malloc(sVar3 + 0xb);
    pAig_local->pName = pcVar4;
    sprintf(pAig_local->pName,"%s_%s",pAig->pName,"monotone");
    pAig_local->pSpec = (char *)0x0;
    pAVar5 = Aig_ManConst1(pAig);
    pAVar6 = Aig_ManConst1(pAig_local);
    (pAVar5->field_5).pData = pAVar6;
    for (piCopied = 0; iVar1 = Saig_ManPiNum(pAig), piCopied < iVar1; piCopied = piCopied + 1) {
      pvVar7 = Vec_PtrEntry(pAig->vCis,piCopied);
      pAVar5 = Aig_ObjCreateCi(pAig_local);
      *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
    }
    for (piCopied = 0; iVar1 = Saig_ManRegNum(pAig), piCopied < iVar1; piCopied = piCopied + 1) {
      pVVar8 = pAig->vCis;
      iVar1 = Saig_ManPiNum(pAig);
      pvVar7 = Vec_PtrEntry(pVVar8,piCopied + iVar1);
      poCopied = poCopied + 1;
      pAVar5 = Aig_ObjCreateCi(pAig_local);
      *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
    }
    poCreated = 1;
    pAVar5 = Aig_ObjCreateCi(pAig_local);
    iVar1 = Vec_IntSize(p_00);
    pVVar8 = Vec_PtrAlloc(iVar1);
    for (piCopied = 0; iVar1 = Vec_IntSize(p_00), piCopied < iVar1; piCopied = piCopied + 1) {
      Vec_IntEntry(p_00,piCopied);
      poCreated = poCreated + 1;
      pAVar6 = Aig_ObjCreateCi(pAig_local);
      Vec_PtrPush(pVVar8,pAVar6);
    }
    for (piCopied = 0; iVar1 = Vec_PtrSize(pAig->vObjs), piCopied < iVar1; piCopied = piCopied + 1)
    {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,piCopied);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar6), iVar1 != 0)) {
        pAVar9 = Aig_ObjChild0Copy(pAVar6);
        p1 = Aig_ObjChild1Copy(pAVar6);
        pAVar9 = Aig_And(pAig_local,pAVar9,p1);
        (pAVar6->field_5).pData = pAVar9;
      }
    }
    if (aigPoIndicesArg->attrSafetyInvarIndex == -1) {
      vConseCandFlopOutput = (Vec_Ptr_t *)Aig_ManConst1(pAig_local);
    }
    else {
      pAVar6 = Aig_ManCo(pAig,aigPoIndicesArg->attrSafetyInvarIndex);
      pAVar9 = Aig_ObjFanin0(pAVar6);
      iVar1 = Aig_ObjFaninC0(pAVar6);
      pAVar6 = Aig_NotCond(pAVar9,iVar1);
      iVar1 = Aig_IsComplement(pAVar6);
      if (iVar1 == 0) {
        pAVar6 = Aig_Regular(pAVar6);
        local_158 = (Aig_Obj_t *)(pAVar6->field_5).pData;
      }
      else {
        pAVar6 = Aig_Regular(pAVar6);
        local_158 = Aig_Not((Aig_Obj_t *)(pAVar6->field_5).pData);
      }
      vConseCandFlopOutput = (Vec_Ptr_t *)local_158;
    }
    pAVar6 = Aig_ManCo(pAig,iVar2);
    pAVar9 = Aig_ObjFanin0(pAVar6);
    iVar2 = Aig_ObjFaninC0(pAVar6);
    pAVar6 = Aig_NotCond(pAVar9,iVar2);
    iVar2 = Aig_IsComplement(pAVar6);
    if (iVar2 == 0) {
      pAVar6 = Aig_Regular(pAVar6);
      local_168 = (Aig_Obj_t *)(pAVar6->field_5).pData;
    }
    else {
      pAVar6 = Aig_Regular(pAVar6);
      local_168 = Aig_Not((Aig_Obj_t *)(pAVar6->field_5).pData);
    }
    pAVar5 = Aig_And(pAig_local,local_168,pAVar5);
    pAVar6 = Aig_ManConst1(pAig_local);
    pObjConsecDriver = Aig_Not(pAVar6);
    if (p != (Vec_Int_t *)0x0) {
      for (piCopied = 0; iVar2 = Vec_IntSize(p), piCopied < iVar2; piCopied = piCopied + 1) {
        iVar2 = Vec_IntEntry(p,piCopied);
        pAVar6 = Aig_ManCo(pAig,iVar2);
        pAVar9 = Aig_ObjFanin0(pAVar6);
        iVar2 = Aig_ObjFaninC0(pAVar6);
        pAVar6 = Aig_NotCond(pAVar9,iVar2);
        iVar2 = Aig_IsComplement(pAVar6);
        if (iVar2 == 0) {
          pAVar6 = Aig_Regular(pAVar6);
          local_180 = (Aig_Obj_t *)(pAVar6->field_5).pData;
        }
        else {
          pAVar6 = Aig_Regular(pAVar6);
          local_180 = Aig_Not((Aig_Obj_t *)(pAVar6->field_5).pData);
        }
        pObjConsecDriver = Aig_Or(pAig_local,local_180,pObjConsecDriver);
      }
    }
    iVar2 = Vec_IntSize(p_00);
    p_02 = Vec_PtrAlloc(iVar2);
    iVar2 = Vec_IntSize(p_00);
    p_03 = Vec_PtrAlloc(iVar2);
    for (piCopied = 0; iVar2 = Vec_IntSize(p_00), piCopied < iVar2; piCopied = piCopied + 1) {
      iVar2 = Vec_IntEntry(p_00,piCopied);
      pAVar6 = Aig_ManCo(pAig,iVar2);
      pAVar9 = Aig_ObjFanin0(pAVar6);
      iVar2 = Aig_ObjFaninC0(pAVar6);
      pAVar6 = Aig_NotCond(pAVar9,iVar2);
      iVar2 = Aig_IsComplement(pAVar6);
      if (iVar2 == 0) {
        pAVar6 = Aig_Regular(pAVar6);
        local_198 = (Aig_Obj_t *)(pAVar6->field_5).pData;
      }
      else {
        pAVar6 = Aig_Regular(pAVar6);
        local_198 = Aig_Not((Aig_Obj_t *)(pAVar6->field_5).pData);
      }
      pAVar6 = Aig_Or(pAig_local,local_198,pObjConsecDriver);
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pVVar8,piCopied);
      pAVar9 = Aig_And(pAig_local,pAVar5,pAVar9);
      pAVar9 = Aig_Not(pAVar9);
      pAVar9 = Aig_Or(pAig_local,pAVar9,pAVar6);
      pAVar9 = Aig_And(pAig_local,pAVar9,(Aig_Obj_t *)vConseCandFlopOutput);
      Vec_PtrPush(p_03,pAVar6);
      Vec_PtrPush(p_02,pAVar9);
    }
    for (piCopied = 0; iVar2 = Saig_ManPoNum(pAig), piCopied < iVar2; piCopied = piCopied + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,piCopied);
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      pAVar6 = Aig_ObjCreateCo(pAig_local,pAVar6);
      (pAVar5->field_5).pData = pAVar6;
    }
    *startMonotonePropPo = piCopied;
    for (piCopied = 0; iVar2 = Vec_PtrSize(p_02), piCopied < iVar2; piCopied = piCopied + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_02,piCopied);
      Aig_ObjCreateCo(pAig_local,pAVar5);
    }
    for (piCopied = 0; iVar2 = Saig_ManRegNum(pAig), piCopied < iVar2; piCopied = piCopied + 1) {
      p_01 = pAig->vCos;
      iVar2 = Saig_ManPoNum(pAig);
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_01,piCopied + iVar2);
      loCopied = loCopied + 1;
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      Aig_ObjCreateCo(pAig_local,pAVar5);
    }
    loCreated = 1;
    Aig_ObjCreateCo(pAig_local,local_168);
    for (piCopied = 0; iVar2 = Vec_PtrSize(p_03), piCopied < iVar2; piCopied = piCopied + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_03,piCopied);
      loCreated = loCreated + 1;
      Aig_ObjCreateCo(pAig_local,pAVar5);
    }
    Aig_ManSetRegNum(pAig_local,poCreated + poCopied);
    Aig_ManCleanup(pAig_local);
    iVar2 = Aig_ManCheck(pAig_local);
    if (iVar2 == 0) {
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                    ,0x10a,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    if (poCopied + poCreated != loCopied + loCreated) {
      __assert_fail("loCopied + loCreated == liCopied + liCreated",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                    ,0x10b,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    Vec_PtrFree(pVVar8);
    Vec_PtrFree(p_02);
    Vec_PtrFree(p_03);
  }
  return pAig_local;
}

Assistant:

Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, 
					struct antecedentConsequentVectorsStruct *anteConseVectors, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pObjConseCandFlop, *pObjSafetyInvariantPoDriver;
	//Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vConseCandFlopOutput;
	//Vec_Ptr_t *vHintMonotoneLocalProp;

	Aig_Obj_t *pObjAnteDisjunction, *pObjConsecDriver, *pObjConsecDriverNew, *pObjCandMonotone, *pObjPrevCandMonotone, *pObjMonotonePropDriver;
	Vec_Ptr_t *vCandMonotoneProp;
	Vec_Ptr_t *vCandMonotoneFlopInput;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

	Vec_Int_t *vAntecedentsLocal = anteConseVectors->attrAntecedents;
	Vec_Int_t *vConsequentCandidatesLocal = anteConseVectors->attrConsequentCandidates;

	if( vConsequentCandidatesLocal == NULL )
		return NULL; //no candidates for consequent is provided, hence no need to generate a new AIG

	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 2 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vConseCandFlopOutput = Vec_PtrAlloc(Vec_IntSize(vConsequentCandidatesLocal));
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		loCreated++;
		pObjConseCandFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vConseCandFlopOutput, pObjConseCandFlop );
	}

	nRegCount = loCreated + loCopied;

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	if( aigPoIndicesArg->attrSafetyInvarIndex != -1 )
	{
		pObjPo = Aig_ManCo( pAig, aigPoIndicesArg->attrSafetyInvarIndex );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
		pObjSafetyInvariantPoDriver = pObjDriverNew;
	}
	else
		pObjSafetyInvariantPoDriver = Aig_ManConst1(pNewAig);

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	pObjAnteDisjunction = Aig_Not(Aig_ManConst1( pNewAig ));
	if( vAntecedentsLocal )
	{
		Vec_IntForEachEntry( vAntecedentsLocal, iElem, i )
		{
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

			pObjAnteDisjunction = Aig_Or( pNewAig, pObjDriverNew, pObjAnteDisjunction );
		}
	}

	vCandMonotoneProp = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	vCandMonotoneFlopInput = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjConsecDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjConsecDriverNew = !Aig_IsComplement(pObjConsecDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData));

		pObjCandMonotone = Aig_Or( pNewAig, pObjConsecDriverNew, pObjAnteDisjunction );
		pObjPrevCandMonotone = (Aig_Obj_t *)(Vec_PtrEntry( vConseCandFlopOutput, i ));
		pObjMonotonePropDriver = Aig_Or( pNewAig, Aig_Not( Aig_And( pNewAig, pObjPendingAndNextPending, pObjPrevCandMonotone ) ), 
						pObjCandMonotone );

		//Conjunting safety invar
		pObjMonotonePropDriver = Aig_And( pNewAig, pObjMonotonePropDriver, pObjSafetyInvariantPoDriver );
						
		Vec_PtrPush( vCandMonotoneFlopInput, pObjCandMonotone );
		Vec_PtrPush( vCandMonotoneProp, pObjMonotonePropDriver );
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneFlopInput, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	Vec_PtrFree(vConseCandFlopOutput);
	Vec_PtrFree(vCandMonotoneProp);
	Vec_PtrFree(vCandMonotoneFlopInput);
	return pNewAig;
}